

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmTruth.c
# Opt level: O0

int Mpm_CutComputeTruth(Mpm_Man_t *p,Mpm_Cut_t *pCut,Mpm_Cut_t *pCut0,Mpm_Cut_t *pCut1,
                       Mpm_Cut_t *pCutC,int fCompl0,int fCompl1,int fComplC,int Type)

{
  int local_38;
  int RetValue;
  int fCompl0_local;
  Mpm_Cut_t *pCutC_local;
  Mpm_Cut_t *pCut1_local;
  Mpm_Cut_t *pCut0_local;
  Mpm_Cut_t *pCut_local;
  Mpm_Man_t *p_local;
  
  if (p->nLutSize < 7) {
    local_38 = Mpm_CutComputeTruth6(p,pCut,pCut0,pCut1,pCutC,fCompl0,fCompl1,fComplC,Type);
  }
  else {
    local_38 = Mpm_CutComputeTruth7(p,pCut,pCut0,pCut1,pCutC,fCompl0,fCompl1,fComplC,Type);
  }
  return local_38;
}

Assistant:

int Mpm_CutComputeTruth( Mpm_Man_t * p, Mpm_Cut_t * pCut, Mpm_Cut_t * pCut0, Mpm_Cut_t * pCut1, Mpm_Cut_t * pCutC, int fCompl0, int fCompl1, int fComplC, int Type )
{
    int RetValue;
    if ( p->nLutSize <= 6 )
        RetValue = Mpm_CutComputeTruth6( p, pCut, pCut0, pCut1, pCutC, fCompl0, fCompl1, fComplC, Type );
    else
        RetValue = Mpm_CutComputeTruth7( p, pCut, pCut0, pCut1, pCutC, fCompl0, fCompl1, fComplC, Type );
#ifdef MPM_TRY_NEW
    {
        extern unsigned Abc_TtCanonicize( word * pTruth, int nVars, char * pCanonPerm );
        char pCanonPerm[16];
        memcpy( p->Truth0, p->Truth, sizeof(word) * p->nTruWords );
        Abc_TtCanonicize( p->Truth0, pCut->nLimit, pCanonPerm );
    }
#endif
    return RetValue;
}